

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

mod2entry * mod2sparse_insert(mod2sparse *m,int row,int col)

{
  mod2entry **ppmVar1;
  int iVar2;
  uint uVar3;
  mod2block *pmVar4;
  mod2entry *pmVar5;
  mod2entry *extraout_RAX;
  mod2entry *pmVar6;
  mod2entry *extraout_RAX_00;
  long lVar7;
  mod2entry *pmVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  uint uVar9;
  undefined4 in_register_00000034;
  FILE *pFVar10;
  FILE *r;
  FILE *pFVar11;
  FILE *__stream;
  ulong uVar12;
  ulong uStack_b0;
  
  pFVar10 = (FILE *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    pmVar6 = m->rows[(uint)row].left;
    if (pmVar6->row < 0) {
LAB_00121a38:
      pmVar6 = pmVar6->right;
    }
    else {
      if (pmVar6->col == col) {
        return pmVar6;
      }
      if ((pmVar6->row < 0) || (pmVar6->col < col)) goto LAB_00121a38;
      pmVar6 = m->rows[(uint)row].right;
      iVar2 = pmVar6->row;
      while (-1 < iVar2) {
        if (pmVar6->col == col) {
          return pmVar6;
        }
        if ((iVar2 < 0) || (col < pmVar6->col)) break;
        pmVar6 = pmVar6->right;
        iVar2 = pmVar6->row;
      }
    }
    if (m->next_free == (mod2entry *)0x0) {
      pmVar4 = (mod2block *)chk_alloc(1,0x238);
      pmVar4->next = m->blocks;
      m->blocks = pmVar4;
      pmVar5 = (mod2entry *)&pmVar4[-1].entry[9].left;
      lVar7 = 10;
      pmVar8 = m->next_free;
      do {
        pmVar5[1].left = pmVar8;
        pmVar5 = pmVar5 + 1;
        lVar7 = lVar7 + -1;
        pmVar8 = pmVar5;
      } while (lVar7 != 0);
      m->next_free = pmVar5;
    }
    pmVar8 = m->next_free;
    m->next_free = pmVar8->left;
    pmVar8->pr = 0.0;
    pmVar8->lr = 0.0;
    pmVar8->row = row;
    pmVar8->col = col;
    pmVar5 = pmVar6->left;
    pmVar8->left = pmVar5;
    pmVar8->right = pmVar6;
    pmVar5->right = pmVar8;
    pmVar8->right->left = pmVar8;
    ppmVar1 = &m->cols;
    pFVar10 = (FILE *)(*ppmVar1)[(uint)col].up;
    uVar9 = pFVar10->_flags;
    m = (mod2sparse *)(ulong)uVar9;
    if (uVar9 == row && -1 < (int)uVar9) goto LAB_00121b7d;
    m = (mod2sparse *)(ulong)CONCAT31((int3)(uVar9 >> 8),row <= (int)uVar9);
    if ((int)uVar9 < 0 || row > (int)uVar9) {
      pmVar6 = (mod2entry *)pFVar10->_IO_write_base;
LAB_00121ae9:
      pmVar5 = pmVar6->up;
      pmVar8->up = pmVar5;
      pmVar8->down = pmVar6;
      pmVar5->down = pmVar8;
      pmVar8->down->up = pmVar8;
      return pmVar8;
    }
    pmVar6 = (*ppmVar1)[(uint)col].down;
    while( true ) {
      uVar9 = pmVar6->row;
      pFVar10 = (FILE *)CONCAT71((int7)((ulong)pFVar10 >> 8),-1 < (int)uVar9);
      m = (mod2sparse *)CONCAT71((int7)((ulong)m >> 8),uVar9 == row);
      if (-1 < (int)uVar9 && uVar9 == row) break;
      if ((uint)row < uVar9) goto LAB_00121ae9;
      pmVar6 = pmVar6->down;
    }
    mod2sparse_insert_cold_1();
  }
  mod2sparse_insert_cold_3();
LAB_00121b7d:
  mod2sparse_insert_cold_2();
  r = pFVar10;
  pFVar11 = (FILE *)m;
  if (*(int *)&((FILE *)m)->field_0x4 <= *(int *)&pFVar10->field_0x4) {
    pFVar11 = pFVar10;
    mod2sparse_clear((mod2sparse *)pFVar10);
    pmVar6 = extraout_RAX;
    if (0 < pFVar10->_flags) {
      uVar12 = 0;
      do {
        iVar2 = *(int *)(extraout_RDX + uVar12 * 4);
        if (((long)iVar2 < 0) || (((FILE *)m)->_flags <= iVar2)) {
          mod2sparse_copyrows_cold_1();
          goto LAB_00121bfe;
        }
        for (pmVar6 = ((mod2entry *)((FILE *)m)->_IO_read_ptr)[iVar2].right; -1 < pmVar6->row;
            pmVar6 = pmVar6->right) {
          r = (FILE *)(uVar12 & 0xffffffff);
          pFVar11 = pFVar10;
          mod2sparse_insert((mod2sparse *)pFVar10,(int)uVar12,pmVar6->col);
        }
        uVar12 = uVar12 + 1;
        pmVar6 = (mod2entry *)(long)pFVar10->_flags;
      } while ((long)uVar12 < (long)pmVar6);
    }
    return pmVar6;
  }
LAB_00121bfe:
  mod2sparse_copyrows_cold_2();
  pFVar10 = r;
  __stream = pFVar11;
  if (r->_flags < pFVar11->_flags) {
LAB_00121c7d:
    mod2sparse_copycols_cold_2();
    iVar2 = pFVar10->_flags;
    uVar9 = 1;
    uStack_b0 = 0x100000000;
    if ((((10 < iVar2) && (uStack_b0 = 0x200000000, 100 < iVar2)) &&
        (uStack_b0 = 0x300000000, 1000 < iVar2)) && (uStack_b0 = 0x400000000, 10000 < iVar2)) {
      uStack_b0 = (ulong)((100000 < iVar2) + 5) << 0x20;
    }
    uVar3 = *(uint *)&pFVar10->field_0x4;
    pmVar6 = (mod2entry *)(ulong)uVar3;
    if (((10 < (int)uVar3) && (uVar9 = 2, 100 < (int)uVar3)) &&
       ((uVar9 = 3, 1000 < (int)uVar3 && (uVar9 = 4, 10000 < (int)uVar3)))) {
      uVar9 = (100000 < (int)uVar3) + 5;
    }
    if (0 < pFVar10->_flags) {
      uVar12 = 0;
      do {
        fprintf(__stream,"%*d:",uStack_b0 >> 0x20,uVar12 & 0xffffffff);
        for (pmVar6 = ((mod2entry *)pFVar10->_IO_read_ptr)[uVar12].right; -1 < pmVar6->row;
            pmVar6 = pmVar6->right) {
          fprintf(__stream," %*d",(ulong)uVar9,(ulong)(uint)pmVar6->col);
        }
        fputc(10,__stream);
        uVar12 = uVar12 + 1;
        pmVar6 = (mod2entry *)(long)pFVar10->_flags;
      } while ((long)uVar12 < (long)pmVar6);
    }
    return pmVar6;
  }
  __stream = r;
  mod2sparse_clear((mod2sparse *)r);
  pmVar6 = extraout_RAX_00;
  if (0 < *(int *)&r->field_0x4) {
    lVar7 = 0;
    do {
      iVar2 = *(int *)(extraout_RDX_00 + lVar7 * 4);
      if (((long)iVar2 < 0) || (*(int *)&pFVar11->field_0x4 <= iVar2)) {
        mod2sparse_copycols_cold_1();
        goto LAB_00121c7d;
      }
      pmVar6 = ((mod2entry *)pFVar11->_IO_read_end)[iVar2].down;
      while( true ) {
        uVar9 = pmVar6->row;
        pFVar10 = (FILE *)(ulong)uVar9;
        if ((int)uVar9 < 0) break;
        __stream = r;
        mod2sparse_insert((mod2sparse *)r,uVar9,(int)lVar7);
        pmVar6 = pmVar6->down;
      }
      lVar7 = lVar7 + 1;
      pmVar6 = (mod2entry *)(long)*(int *)&r->field_0x4;
    } while (lVar7 < (long)pmVar6);
  }
  return pmVar6;
}

Assistant:

mod2entry *mod2sparse_insert
( mod2sparse *m,
  int row,
  int col
)
{
  mod2entry *re, *ce, *ne;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_insert: row or column index out of bounds\n");
    exit(1);
  }

  /* Find old entry and return it, or allocate new entry and insert into row. */

  re = mod2sparse_last_in_row(m,row);

  if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
  { return re;
  }

  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { re = re->right;
  }
  else
  {
    re = mod2sparse_first_in_row(m,row);

    for (;;)
    { 
      if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
      { return re;
      }

      if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
      { break;
      } 

      re = mod2sparse_next_in_row(re);
    }
  }

  ne = alloc_entry(m);

  ne->row = row;
  ne->col = col;

  ne->left = re->left;
  ne->right = re;
  ne->left->right = ne;
  ne->right->left = ne;

  /* Insert new entry into column.  If we find an existing entry here,
     the matrix must be garbled, since we didn't find it in the row. */

  ce = mod2sparse_last_in_col(m,col);

  if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
  { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
    exit(1);
  }

  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row) 
  { ce = ce->down;
  }
  else
  {
    ce = mod2sparse_first_in_col(m,col);

    for (;;)
    { 
      if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
      { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
        exit(1);
      }

      if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
      { break;
      } 

      ce = mod2sparse_next_in_col(ce);
    }
  }
    
  ne->up = ce->up;
  ne->down = ce;
  ne->up->down = ne;
  ne->down->up = ne;

  /* Return the new entry. */

  return ne;
}